

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CloseCurrentPopup(void)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  ImGuiPopupData *pIVar4;
  ImGuiWindow *window;
  bool close_parent;
  ImGuiWindow *parent_popup_window;
  ImGuiWindow *popup_window;
  int popup_idx;
  ImGuiContext *g;
  int in_stack_ffffffffffffffcc;
  ImGuiID i;
  ImVector<ImGuiPopupData> *in_stack_ffffffffffffffd0;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  int local_c;
  
  pIVar3 = GImGui;
  local_c = (GImGui->BeginPopupStack).Size + -1;
  if ((-1 < local_c) && (local_c < (GImGui->OpenPopupStack).Size)) {
    pIVar4 = ImVector<ImGuiPopupData>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    i = pIVar4->PopupId;
    pIVar4 = ImVector<ImGuiPopupData>::operator[](in_stack_ffffffffffffffd0,i);
    if (i == pIVar4->PopupId) {
      for (; 0 < local_c; local_c = local_c + -1) {
        pIVar4 = ImVector<ImGuiPopupData>::operator[](in_stack_ffffffffffffffd0,i);
        pIVar1 = pIVar4->Window;
        pIVar4 = ImVector<ImGuiPopupData>::operator[](in_stack_ffffffffffffffd0,i);
        in_stack_ffffffffffffffe0 = pIVar4->Window;
        bVar2 = false;
        if (((pIVar1 != (ImGuiWindow *)0x0) && ((pIVar1->Flags & 0x10000000U) != 0)) &&
           ((in_stack_ffffffffffffffe0 == (ImGuiWindow *)0x0 ||
            ((in_stack_ffffffffffffffe0->Flags & 0x8000000U) == 0)))) {
          bVar2 = true;
        }
        if (!bVar2) break;
      }
      ClosePopupToLevel((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                        SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x18,0));
      if (pIVar3->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar3->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    //IMGUI_DEBUG_LOG("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}